

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_net.hpp
# Opt level: O1

address * __thiscall
libtorrent::aux::
bind_socket_to_device<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>>
          (address *__return_storage_ptr__,aux *this,io_context *ios,
          polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
          *sock,tcp *protocol,char *device_name,int port,error_code *ec)

{
  anon_enum_32 aVar1;
  pointer ec_00;
  bool bVar2;
  pointer piVar3;
  int iVar4;
  tcp *ptVar5;
  anon_enum_32 *paVar6;
  undefined8 extraout_RAX;
  io_context *__variants;
  pointer addr;
  undefined4 in_stack_0000000c;
  vector<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_> ifs;
  bytes_type bytes;
  undefined1 local_a4 [28];
  vector<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_> local_88;
  address local_68;
  io_context *local_48;
  io_context *local_40;
  tcp *local_38;
  
  ec_00 = (pointer)CONCAT44(in_stack_0000000c,port);
  local_68.ipv6_address_.addr_.__in6_u._8_8_ = 0;
  local_68.ipv6_address_.scope_id_ = 0;
  local_68._0_8_ = (pointer)0x0;
  local_68.ipv6_address_.addr_.__in6_u._0_8_ = 0;
  local_48 = (io_context *)this;
  local_40 = ios;
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            ((basic_endpoint<boost::asio::ip::tcp> *)local_a4,&local_68,(unsigned_short)device_name)
  ;
  local_38 = (tcp *)0x0;
  iVar4 = boost::asio::detail::socket_ops::inet_pton(10,(char *)protocol,&local_68);
  if (iVar4 < 1) {
    local_88.
    super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ptVar5 = (tcp *)0x0;
  }
  else {
    local_88.
    super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_68._0_8_;
    local_88.
    super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_68.ipv6_address_.addr_.__in6_u._0_8_
    ;
    ptVar5 = local_38;
  }
  if (*(bool *)&(ec_00->interface_address).ipv4_address_.addr_.s_addr == false) {
    local_68.type_ = ipv6;
    local_68.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    local_68.ipv6_address_.addr_.__in6_u._0_8_ =
         local_88.
         super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_68.ipv6_address_.addr_.__in6_u._8_8_ =
         local_88.
         super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_68.ipv6_address_.scope_id_ = (unsigned_long)ptVar5;
  }
  else {
    paVar6 = (anon_enum_32 *)__errno_location();
    *paVar6 = ipv4;
    iVar4 = inet_pton(2,(char *)protocol,&local_68);
    aVar1 = *paVar6;
    (ec_00->interface_address).type_ = aVar1;
    *(bool *)&(ec_00->interface_address).ipv4_address_.addr_.s_addr = aVar1 != ipv4;
    *(system_error_category **)&(ec_00->interface_address).ipv6_address_.addr_.__in6_u =
         &boost::system::detail::cat_holder<void>::system_category_instance;
    if (iVar4 < 1 && aVar1 == ipv4) {
      (ec_00->interface_address).type_ = 0x16;
      (ec_00->interface_address).ipv4_address_ = (in4_addr_type)0x1;
      *(system_error_category **)&(ec_00->interface_address).ipv6_address_.addr_.__in6_u =
           &boost::system::detail::cat_holder<void>::system_category_instance;
    }
    if (*(bool *)&(ec_00->interface_address).ipv4_address_.addr_.s_addr == false) {
      if (iVar4 < 1) {
        local_68.type_ = ipv4;
      }
      local_68._0_8_ = (ulong)local_68.type_ << 0x20;
    }
    else {
      local_68.type_ = ipv4;
      local_68.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    }
    local_68.ipv6_address_.scope_id_ = 0;
    local_68.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_68.ipv6_address_.addr_.__in6_u.__u6_addr32[0] = ipv4;
    local_68.ipv6_address_.addr_.__in6_u.__u6_addr32[1] = (uint32_t)(in4_addr_type)0x0;
  }
  __variants = local_40;
  if (*(bool *)&(ec_00->interface_address).ipv4_address_.addr_.s_addr == false) {
    if (((local_68.type_ == ipv4) && (local_68.ipv4_address_.addr_.s_addr == 0)) &&
       (*(int *)&(sock->
                 super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                 ).
                 super__Variant_base<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                 .
                 super__Move_assign_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                 .
                 super__Copy_assign_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                 .
                 super__Move_ctor_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                 .
                 super__Copy_ctor_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                 .
                 super__Variant_storage_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
        == 10)) {
      local_68.ipv6_address_.addr_.__in6_u.__u6_addr32[0] = ipv4;
      local_68.ipv6_address_.addr_.__in6_u.__u6_addr32[1] = (uint32_t)(in4_addr_type)0x0;
      local_68.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_68.type_ = ipv6;
      local_68.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
      local_68.ipv6_address_.scope_id_ = 0;
    }
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
              ((basic_endpoint<boost::asio::ip::tcp> *)local_a4,&local_68);
    __variants = local_40;
  }
  else {
    (ec_00->interface_address).type_ = ipv4;
    *(bool *)&(ec_00->interface_address).ipv4_address_.addr_.s_addr = false;
    *(system_error_category **)&(ec_00->interface_address).ipv6_address_.addr_.__in6_u =
         &boost::system::detail::cat_holder<void>::system_category_instance;
    local_88.
    super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_38;
    local_88.
    super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
    ._M_impl.super__Vector_impl_data._M_finish = ec_00;
    local_38 = protocol;
    ::std::
    visit<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::___ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>&>
              ((anon_class_16_2_c962e082 *)&local_88,
               (variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                *)local_40);
    if (*(bool *)&(ec_00->interface_address).ipv4_address_.addr_.s_addr == true) {
      (ec_00->interface_address).type_ = ipv4;
      *(bool *)&(ec_00->interface_address).ipv4_address_.addr_.s_addr = false;
      *(system_error_category **)&(ec_00->interface_address).ipv6_address_.addr_.__in6_u =
           &boost::system::detail::cat_holder<void>::system_category_instance;
      enum_net_interfaces(&local_88,local_48,(error_code *)ec_00);
      piVar3 = local_88.
               super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (*(bool *)&(ec_00->interface_address).ipv4_address_.addr_.s_addr != true) {
        if (local_88.
            super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_88.
            super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_48 = (io_context *)((ulong)local_48 & 0xffffffff00000000);
          addr = local_88.
                 super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          do {
            iVar4 = strcmp(addr->name,(char *)protocol);
            if ((iVar4 == 0) &&
               ((*(int *)&(sock->
                          super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                          ).
                          super__Variant_base<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                          .
                          super__Move_assign_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                          .
                          super__Copy_assign_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                          .
                          super__Move_ctor_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                          .
                          super__Copy_ctor_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                          .
                          super__Variant_storage_alias<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                == 2) == ((addr->interface_address).type_ == ipv4))) {
              boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                        ((basic_endpoint<boost::asio::ip::tcp> *)local_a4,&addr->interface_address);
              local_48 = (io_context *)
                         CONCAT44(local_48._4_4_,(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1));
              bVar2 = true;
            }
            else {
              bVar2 = false;
            }
            __variants = local_40;
          } while ((!bVar2) && (addr = addr + 1, addr != piVar3));
          if (((ulong)local_48 & 1) != 0) {
            if (local_88.
                super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_88.
                              super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_88.
                                    super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_88.
                                    super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            goto LAB_002e1b78;
          }
        }
        (ec_00->interface_address).type_ = 0x13;
        *(bool *)&(ec_00->interface_address).ipv4_address_.addr_.s_addr = true;
        *(generic_error_category **)&(ec_00->interface_address).ipv6_address_.addr_.__in6_u =
             &boost::system::detail::cat_holder<void>::generic_category_instance;
      }
      if (local_a4._0_2_ == 2) {
        __return_storage_ptr__->type_ = ipv4;
        (__return_storage_ptr__->ipv4_address_).addr_.s_addr = local_a4._4_4_;
        *(undefined8 *)&(__return_storage_ptr__->ipv6_address_).addr_.__in6_u = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->ipv6_address_).addr_.__in6_u + 8) = 0;
        (__return_storage_ptr__->ipv6_address_).scope_id_ = 0;
      }
      else {
        *(undefined8 *)&(__return_storage_ptr__->ipv6_address_).addr_.__in6_u = local_a4._8_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ipv6_address_).addr_.__in6_u + 8) =
             local_a4._16_8_;
        __return_storage_ptr__->type_ = ipv6;
        __return_storage_ptr__->ipv4_address_ = (in4_addr_type)0x0;
        (__return_storage_ptr__->ipv6_address_).scope_id_ = (ulong)(uint)local_a4._24_4_;
      }
      if (local_88.
          super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        return __return_storage_ptr__;
      }
      operator_delete(local_88.
                      super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      return __return_storage_ptr__;
    }
  }
LAB_002e1b78:
  local_88.
  super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_a4;
  local_88.
  super__Vector_base<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>.
  _M_impl.super__Vector_impl_data._M_finish = ec_00;
  ::std::
  visit<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::___ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>&>
            ((anon_class_16_2_e6882782 *)&local_88,
             (variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
              *)__variants);
  if (local_a4._0_2_ == 2) {
    __return_storage_ptr__->type_ = ipv4;
    (__return_storage_ptr__->ipv4_address_).addr_.s_addr = local_a4._4_4_;
    *(undefined8 *)&(__return_storage_ptr__->ipv6_address_).addr_.__in6_u = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->ipv6_address_).addr_.__in6_u + 8) = 0;
    (__return_storage_ptr__->ipv6_address_).scope_id_ = 0;
  }
  else {
    *(undefined8 *)&(__return_storage_ptr__->ipv6_address_).addr_.__in6_u = local_a4._8_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->ipv6_address_).addr_.__in6_u + 8) =
         local_a4._16_8_;
    __return_storage_ptr__->type_ = ipv6;
    __return_storage_ptr__->ipv4_address_ = (in4_addr_type)0x0;
    (__return_storage_ptr__->ipv6_address_).scope_id_ = (ulong)(uint)local_a4._24_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

address bind_socket_to_device(io_context& ios, Socket& sock
		, tcp const& protocol
		, char const* device_name, int port, error_code& ec)
	{
		tcp::endpoint bind_ep(address_v4::any(), std::uint16_t(port));

		address ip = make_address(device_name, ec);
		if (!ec)
		{
			// this is to cover the case where "0.0.0.0" is considered any IPv4 or
			// IPv6 address. If we're asking to be bound to an IPv6 address and
			// providing 0.0.0.0 as the device, turn it into "::"
			if (ip == address_v4::any() && protocol == boost::asio::ip::tcp::v6())
				ip = address_v6::any();
			bind_ep.address(ip);
			// it appears to be an IP. Just bind to that address
			sock.bind(bind_ep, ec);
			return bind_ep.address();
		}

		ec.clear();

#if TORRENT_HAS_BINDTODEVICE
		// try to use SO_BINDTODEVICE here, if that exists. If it fails,
		// fall back to the mechanism we have below
		aux::bind_device(sock, device_name, ec);
		if (ec)
#endif
		{
			ec.clear();
			// TODO: 2 this could be done more efficiently by just looking up
			// the interface with the given name, maybe even with if_nametoindex()
			std::vector<ip_interface> ifs = enum_net_interfaces(ios, ec);
			if (ec) return bind_ep.address();

			bool found = false;

			for (auto const& iface : ifs)
			{
				// we're looking for a specific interface, and its address
				// (which must be of the same family as the address we're
				// connecting to)
				if (std::strcmp(iface.name, device_name) != 0) continue;
				if (iface.interface_address.is_v4() != (protocol == boost::asio::ip::tcp::v4()))
					continue;

				bind_ep.address(iface.interface_address);
				found = true;
				break;
			}

			if (!found)
			{
				ec = error_code(boost::system::errc::no_such_device, generic_category());
				return bind_ep.address();
			}
		}
		sock.bind(bind_ep, ec);
		return bind_ep.address();
	}